

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkinformation_p.cpp
# Opt level: O2

void QNetworkInformationBackend::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  
  if (_c == IndexOfMethod) {
    bVar1 = QtMocHelpers::
            indexOfMethod<void(QNetworkInformationBackend::*)(QNetworkInformation::Reachability)>
                      ((QtMocHelpers *)_a,(void **)reachabilityChanged,0,0);
    if (((!bVar1) &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkInformationBackend::*)(bool)>
                           ((QtMocHelpers *)_a,(void **)behindCaptivePortalChanged,0,1), !bVar1)) &&
       (bVar1 = QtMocHelpers::
                indexOfMethod<void(QNetworkInformationBackend::*)(QNetworkInformation::TransportMedium)>
                          ((QtMocHelpers *)_a,(void **)transportMediumChanged,0,2), !bVar1)) {
      QtMocHelpers::indexOfMethod<void(QNetworkInformationBackend::*)(bool)>
                ((QtMocHelpers *)_a,(void **)isMeteredChanged,0,3);
      return;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      reachabilityChanged((QNetworkInformationBackend *)_o,*_a[1]);
      return;
    case 1:
      behindCaptivePortalChanged((QNetworkInformationBackend *)_o,*_a[1]);
      return;
    case 2:
      transportMediumChanged((QNetworkInformationBackend *)_o,*_a[1]);
      return;
    case 3:
      isMeteredChanged((QNetworkInformationBackend *)_o,*_a[1]);
      return;
    }
  }
  return;
}

Assistant:

void QNetworkInformationBackend::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkInformationBackend *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->reachabilityChanged((*reinterpret_cast< std::add_pointer_t<QNetworkInformation::Reachability>>(_a[1]))); break;
        case 1: _t->behindCaptivePortalChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->transportMediumChanged((*reinterpret_cast< std::add_pointer_t<QNetworkInformation::TransportMedium>>(_a[1]))); break;
        case 3: _t->isMeteredChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkInformationBackend::*)(QNetworkInformation::Reachability )>(_a, &QNetworkInformationBackend::reachabilityChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkInformationBackend::*)(bool )>(_a, &QNetworkInformationBackend::behindCaptivePortalChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkInformationBackend::*)(QNetworkInformation::TransportMedium )>(_a, &QNetworkInformationBackend::transportMediumChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkInformationBackend::*)(bool )>(_a, &QNetworkInformationBackend::isMeteredChanged, 3))
            return;
    }
}